

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaValidateDoc(xmlSchemaValidCtxtPtr ctxt,xmlDocPtr doc)

{
  int iVar1;
  xmlNodePtr pxVar2;
  
  iVar1 = -1;
  if (doc != (xmlDocPtr)0x0 && ctxt != (xmlSchemaValidCtxtPtr)0x0) {
    ctxt->doc = doc;
    pxVar2 = xmlDocGetRootElement(doc);
    ctxt->node = pxVar2;
    if (pxVar2 != (xmlNodePtr)0x0) {
      ctxt->validationRoot = pxVar2;
      iVar1 = xmlSchemaVStart(ctxt);
      return iVar1;
    }
    xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)ctxt,XML_SCHEMAV_DOCUMENT_ELEMENT_MISSING,
                        (xmlNodePtr)doc,(xmlSchemaBasicItemPtr)0x0,
                        "The document has no document element",(xmlChar *)0x0,(xmlChar *)0x0,
                        (xmlChar *)0x0,(xmlChar *)0x0);
    iVar1 = ctxt->err;
  }
  return iVar1;
}

Assistant:

int
xmlSchemaValidateDoc(xmlSchemaValidCtxtPtr ctxt, xmlDocPtr doc)
{
    if ((ctxt == NULL) || (doc == NULL))
        return (-1);

    ctxt->doc = doc;
    ctxt->node = xmlDocGetRootElement(doc);
    if (ctxt->node == NULL) {
        xmlSchemaCustomErr(ACTXT_CAST ctxt,
	    XML_SCHEMAV_DOCUMENT_ELEMENT_MISSING,
	    (xmlNodePtr) doc, NULL,
	    "The document has no document element", NULL, NULL);
        return (ctxt->err);
    }
    ctxt->validationRoot = ctxt->node;
    return (xmlSchemaVStart(ctxt));
}